

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string local_28a0;
  undefined1 local_2880 [8];
  Game game;
  undefined1 local_d0 [7];
  Controller controller;
  Renderer renderer;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  int local_80;
  int i;
  allocator<char> local_69;
  string local_68 [8];
  string map_file_path;
  size_t kGridHeight;
  size_t kGridWidth;
  size_t kScreenHeight;
  size_t kScreenWidth;
  size_t kMsPerFrame;
  size_t kFramesPerSecond;
  char **argv_local;
  int argc_local;
  
  map_file_path.field_2._8_8_ = 0x20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"",&local_69);
  std::allocator<char>::~allocator(&local_69);
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "To specify a map file use the following format: ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Usage: [executable] [-m path_to_map.map]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::operator=(local_68,"../maps/map2.map");
  }
  else {
    for (local_80 = 1; local_80 < argc; local_80 = local_80 + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_90,argv[local_80]);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&renderer.grid_height,"-m");
      bVar1 = std::operator==(local_90,stack0xffffffffffffff60);
      if ((bVar1) && (local_80 = local_80 + 1, local_80 < argc)) {
        std::__cxx11::string::operator=(local_68,argv[local_80]);
      }
    }
  }
  Renderer::Renderer((Renderer *)local_d0,0x280,0x280,0x20,0x20);
  std::__cxx11::string::string((string *)&local_28a0,local_68);
  Game::Game((Game *)local_2880,0x20,0x20,&local_28a0);
  std::__cxx11::string::~string((string *)&local_28a0);
  Game::Run((Game *)local_2880,(Controller *)&game.field_0x27a7,(Renderer *)local_d0,0x10);
  std::operator<<((ostream *)&std::cout,"Game has terminated successfully!\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Score: ");
  iVar2 = Game::GetScore((Game *)local_2880);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Size: ");
  iVar2 = Game::GetSize((Game *)local_2880);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,"\n");
  Game::~Game((Game *)local_2880);
  Renderer::~Renderer((Renderer *)local_d0);
  std::__cxx11::string::~string(local_68);
  return 0;
}

Assistant:

int main(int argc, const char **argv) {
    constexpr std::size_t kFramesPerSecond{60};
    constexpr std::size_t kMsPerFrame{1000 / kFramesPerSecond};
    constexpr std::size_t kScreenWidth{640};
    constexpr std::size_t kScreenHeight{640};
    constexpr std::size_t kGridWidth{32};
    constexpr std::size_t kGridHeight{32};

  // For taking user input for custom maps
    std::string map_file_path = "";
    if (argc > 1) {
        for (int i = 1; i < argc; ++i)
            if (std::string_view{argv[i]} == "-m" && ++i < argc)
                map_file_path = argv[i];

    } else {
        std::cout << "To specify a map file use the following format: " << std::endl;
        std::cout << "Usage: [executable] [-m path_to_map.map]" << std::endl;
        map_file_path = "../maps/map2.map";
    }

    Renderer renderer(kScreenWidth, kScreenHeight, kGridWidth, kGridHeight);
    Controller controller;
    Game game(kGridWidth, kGridHeight, map_file_path);
    game.Run(controller, renderer, kMsPerFrame);
    std::cout << "Game has terminated successfully!\n";
    std::cout << "Score: " << game.GetScore() << "\n";
    std::cout << "Size: " << game.GetSize() << "\n";
    return 0;
}